

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O0

void __thiscall geometrycentral::DisjointSets::DisjointSets(DisjointSets *this,size_t n_)

{
  allocator_type *__a;
  reference pvVar1;
  pointer in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  undefined1 *__n;
  pointer local_30;
  undefined1 local_25 [37];
  
  (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2ed716);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2ed736);
  __a = (allocator_type *)
        ((long)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start + 1);
  __n = local_25;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2ed761);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_RDI,(size_type)__n,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2ed781);
  for (local_30 = (pointer)0x0;
      local_30 <=
      (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start; local_30 = (pointer)((long)local_30 + 1)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(size_type)local_30);
    *pvVar1 = 0;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish,(size_type)local_30);
    *pvVar1 = (value_type)local_30;
  }
  return;
}

Assistant:

DisjointSets::DisjointSets(size_t n_) : n(n_), parent(n + 1), rank(n + 1) {
  // Initialize all elements to be in different sets and to have rank 0
  for (size_t i = 0; i <= n; i++) {
    rank[i] = 0;
    parent[i] = i;
  }
}